

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedBlackTree.cpp
# Opt level: O2

void __thiscall RedBlackTree::merge(RedBlackTree *this,RedBlackTree *RedBlackTree2)

{
  Node *pNVar1;
  int iVar2;
  int iVar3;
  Node *node;
  Node *pNVar4;
  RedBlackTree *pRVar5;
  uint data;
  Node *pNVar6;
  Node *node_00;
  Node *pNVar7;
  Node *c;
  Node *local_40;
  Node *local_38;
  
  node = this->root;
  node_00 = RedBlackTree2->root;
  pRVar5 = this;
  iVar2 = getBlackHeight(this,node);
  iVar3 = getBlackHeight(pRVar5,node_00);
  pNVar4 = (Node *)this;
  if (iVar3 < iVar2) {
    do {
      pNVar7 = node;
      node = pNVar7->right;
    } while (pNVar7->right != (Node *)0x0);
  }
  else {
    pRVar5 = RedBlackTree2;
    if (iVar2 < iVar3) {
      do {
        pNVar7 = node_00;
        node_00 = pNVar7->left;
      } while (pNVar7->left != (Node *)0x0);
      data = pNVar7->value;
      local_40 = pNVar7;
      removeElement(RedBlackTree2,data);
      node_00 = RedBlackTree2->root;
      pNVar4 = (Node *)(ulong)data;
      goto LAB_001073e5;
    }
    do {
      pNVar7 = node_00;
      node_00 = pNVar7->left;
    } while (pNVar7->left != (Node *)0x0);
    data = pNVar7->value;
    local_40 = pNVar7;
    removeElement(RedBlackTree2,data);
    node_00 = RedBlackTree2->root;
    iVar3 = getBlackHeight(pRVar5,node_00);
    if (iVar2 == iVar3) goto LAB_001073e5;
    insertElement(RedBlackTree2,pNVar7->value);
    node_00 = RedBlackTree2->root;
    do {
      pNVar7 = node;
      node = pNVar7->right;
    } while (pNVar7->right != (Node *)0x0);
  }
  data = pNVar7->value;
  pRVar5 = this;
  local_40 = pNVar7;
  removeElement(this,data);
  node = this->root;
LAB_001073e5:
  pNVar7->color = 0;
  iVar2 = getBlackHeight(pRVar5,node);
  iVar3 = getBlackHeight(pRVar5,node_00);
  if (iVar2 == iVar3) {
    pNVar7->left = node;
    node->parent = pNVar7;
    pNVar7->right = node_00;
    node_00->parent = pNVar7;
    pNVar7->color = 1;
    pNVar7->value = data;
    this->root = pNVar7;
  }
  else {
    pNVar1 = node_00;
    pNVar6 = node;
    if (iVar2 < iVar3) {
      while (pNVar6 = pNVar1, iVar3 = getBlackHeight(pRVar5,pNVar6), iVar2 != iVar3) {
        pNVar1 = pNVar6->left;
        pNVar4 = pNVar6;
      }
      if (pNVar6 != (Node *)0x0) {
        pNVar4 = pNVar6->parent;
      }
      pNVar7->left = node;
      if (node != (Node *)0x0) {
        node->parent = pNVar7;
      }
      pNVar7->right = pNVar6;
      if (pNVar6 != (Node *)0x0) {
        pNVar6->parent = pNVar7;
      }
      pNVar4->left = pNVar7;
      pNVar7->parent = pNVar4;
      local_38 = pNVar6;
      if (pNVar4->color == 0) {
        fixInsert(this,&local_40);
        pNVar7 = local_40;
      }
      else if ((pNVar6 != (Node *)0x0) && (pNVar6->color == 0)) {
        fixInsert(this,&local_38);
      }
      pNVar7->value = data;
      this->root = node_00;
    }
    else {
      while (iVar2 = getBlackHeight(pRVar5,pNVar6), iVar3 != iVar2) {
        pNVar6 = pNVar6->right;
      }
      pNVar4 = pNVar6->parent;
      pNVar7->right = node_00;
      node_00->parent = pNVar7;
      pNVar7->left = pNVar6;
      pNVar6->parent = pNVar7;
      pNVar4->right = pNVar7;
      pNVar7->parent = pNVar4;
      local_38 = pNVar6;
      if (pNVar4->color == 0) {
        fixInsert(this,&local_40);
        pNVar7 = local_40;
      }
      else if (pNVar6->color == 0) {
        fixInsert(this,&local_38);
      }
      pNVar7->value = data;
      this->root = node;
    }
  }
  return;
}

Assistant:

void RedBlackTree::merge(RedBlackTree RedBlackTree2) {
    int temp;
    Node *c, *temp_ptr;
    Node *root1 = root;
    Node *root2 = RedBlackTree2.root;

    int initialblackheight1 = getBlackHeight(root1);
    int initialblackheight2 = getBlackHeight(root2);
    if (initialblackheight1 > initialblackheight2) {
        c = findMax(root1);
        temp = c->value;
        removeElement(c->value);
        root1 = root;
    } else if (initialblackheight2 > initialblackheight1) {
        c = findMin(root2);
        temp = c->value;
        RedBlackTree2.removeElement(c->value);
        root2 = RedBlackTree2.root;
    } else {
        c = findMin(root2);
        temp = c->value;
        RedBlackTree2.removeElement(c->value);
        root2 = RedBlackTree2.root;
        if (initialblackheight1 != getBlackHeight(root2)) {
            RedBlackTree2.insertElement(c->value);
            root2 = RedBlackTree2.root;
            c = findMax(root1);
            temp = c->value;
            removeElement(c->value);
            root1 = root;
        }
    }
    setColor(c, RED);

    int finalblackheight1 = getBlackHeight(root1);
    int finalblackheight2 = getBlackHeight(root2);
    if (finalblackheight1 == finalblackheight2) {
        c->left = root1;
        root1->parent = c;
        c->right = root2;
        root2->parent = c;
        setColor(c, BLACK);
        c->value = temp;
        root = c;
    } else if (finalblackheight2 > finalblackheight1) {
        Node *ptr = root2;
        while (finalblackheight1 != getBlackHeight(ptr)) {
            temp_ptr = ptr;
            ptr = ptr->left;
        }
        Node *ptr_parent;
        if (ptr == nullptr) {
            ptr_parent = temp_ptr;
        } else {
            ptr_parent = ptr->parent;
        }
        c->left = root1;
        if (root1 != nullptr) {
            root1->parent = c;
        }
        c->right = ptr;
        if (ptr != nullptr) {
            ptr->parent = c;
        }
        ptr_parent->left = c;
        c->parent = ptr_parent;
        if (getColor(ptr_parent) == RED) {
            {
                fixInsert(c);
            }
        } else if (getColor(ptr) == RED) {
            fixInsert(ptr);
        }
        c->value = temp;
        root = root2;
    } else {
        Node *ptr = root1;
        while (finalblackheight2 != getBlackHeight(ptr)) {
            ptr = ptr->right;
        }
        Node *ptr_parent = ptr->parent;
        c->right = root2;
        root2->parent = c;
        c->left = ptr;
        ptr->parent = c;
        ptr_parent->right = c;
        c->parent = ptr_parent;
        if (getColor(ptr_parent) == RED) {
            fixInsert(c);
        } else if (getColor(ptr) == RED) {
            fixInsert(ptr);
        }
        c->value = temp;
        root = root1;
    }
}